

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::checkValidUnitString(string *unit_string,uint64_t match_flags)

{
  ulong uVar1;
  uint64_t unit;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uStack_60;
  char current;
  size_t index;
  value_type *seq;
  const_iterator __end2;
  const_iterator __begin2;
  array<const_char_*,_2UL> *__range2;
  size_type sStack_30;
  bool skipcodereplacement;
  size_type cx2;
  size_type cx;
  uint64_t match_flags_local;
  string *unit_string_local;
  
  cx = match_flags;
  match_flags_local = (uint64_t)unit_string;
  pcVar4 = (char *)std::__cxx11::string::front();
  if ((*pcVar4 == '^') || (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '^')) {
    return false;
  }
  cx2 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x21357d);
  while (cx2 != 0xffffffffffffffff) {
    sStack_30 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x21357d);
    sVar7 = cx2 + 1;
    cx2 = sStack_30;
    if (sStack_30 == sVar7) {
      return false;
    }
  }
  __range2._7_1_ = (cx & 0x1000000000) != 0;
  if ((bool)__range2._7_1_) {
    return true;
  }
  __begin2 = checkValidUnitString::invalidSequences._M_elems;
  __end2 = std::array<const_char_*,_2UL>::begin(&checkValidUnitString::invalidSequences);
  seq = std::array<const_char_*,_2UL>::end(&checkValidUnitString::invalidSequences);
  for (; __end2 != seq; __end2 = __end2 + 1) {
    index = (size_t)__end2;
    lVar5 = std::__cxx11::string::find((char *)match_flags_local,(ulong)*__end2);
    if (lVar5 != -1) {
      return false;
    }
  }
  uStack_60 = 0;
LAB_001d6859:
  do {
    uVar1 = uStack_60;
    uVar6 = std::__cxx11::string::size();
    if (uVar6 <= uVar1) {
      bVar3 = checkExponentOperations((string *)match_flags_local);
      if (bVar3) {
        return true;
      }
      return false;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](match_flags_local);
    unit = match_flags_local;
    cVar2 = *pcVar4;
    if ((cVar2 != '\"') && (cVar2 != '(')) {
      if (cVar2 == ')') {
        return false;
      }
      if (cVar2 != '[') {
        if (cVar2 == ']') {
          return false;
        }
        if (cVar2 != '{') {
          if (cVar2 == '}') {
            return false;
          }
          uStack_60 = uStack_60 + 1;
          goto LAB_001d6859;
        }
      }
    }
    uStack_60 = uStack_60 + 1;
    cVar2 = getMatchCharacter(cVar2);
    bVar3 = segmentcheck((string *)unit,cVar2,&stack0xffffffffffffffa0);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

static bool checkValidUnitString(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    static constexpr std::array<const char*, 2> invalidSequences{{"-+", "+-"}};
    if (unit_string.front() == '^' || unit_string.back() == '^') {
        return false;
    }
    auto cx = unit_string.find_first_of("*/^");
    while (cx != std::string::npos) {
        auto cx2 = unit_string.find_first_of("*/^", cx + 1);
        if (cx2 == cx + 1) {
            return false;
        }
        cx = cx2;
    }
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    if (!skipcodereplacement) {
        for (const auto& seq : invalidSequences) {
            if (unit_string.find(seq) != std::string::npos) {
                return false;
            }
        }

        size_t index = 0;
        while (index < unit_string.size()) {
            char current = unit_string[index];
            switch (current) {
                case '{':
                case '(':
                case '[':
                case '"':
                    ++index;
                    if (!segmentcheck(
                            unit_string, getMatchCharacter(current), index)) {
                        return false;
                    }
                    break;
                case '}':
                case ')':
                case ']':
                    return false;

                default:
                    ++index;
                    break;
            }
        }
        if (!checkExponentOperations(unit_string)) {
            return false;
        }
    }

    return true;
}